

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::q_points_into_range<QArrayDataPointer<QString>,QString_const*>
               (QString **p,QArrayDataPointer<QString> *c)

{
  undefined8 uVar1;
  bool bVar2;
  QString *__last;
  QString *pQVar3;
  difference_type dVar4;
  undefined8 *in_RDI;
  QString *in_stack_ffffffffffffffe8;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<QString>>((QArrayDataPointer<QString> *)0x11d475);
  pQVar3 = std::data<QArrayDataPointer<QString>>((QArrayDataPointer<QString> *)0x11d484);
  std::begin<QArrayDataPointer<QString>>((QArrayDataPointer<QString> *)0x11d493);
  std::end<QArrayDataPointer<QString>>((QArrayDataPointer<QString> *)0x11d4a1);
  dVar4 = std::distance<QString_const*>(in_stack_ffffffffffffffe8,__last);
  bVar2 = q_points_into_range<QString,std::less<void>>(uVar1,__last,pQVar3 + dVar4);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}